

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O0

RunResult __thiscall
wabt::interp::Thread::
DoSimdIsTrue<wabt::interp::Simd<unsigned_short,(unsigned_char)8>,(unsigned_char)1>(Thread *this)

{
  unsigned_short *puVar1;
  unsigned_short *puVar2;
  difference_type dVar3;
  undefined1 local_20 [8];
  Simd<unsigned_short,_(unsigned_char)__b_> val;
  Thread *this_local;
  
  val.v._8_8_ = this;
  _local_20 = Pop<wabt::interp::Simd<unsigned_short,(unsigned_char)8>>(this);
  puVar1 = std::begin<unsigned_short,8ul>((unsigned_short (*) [8])local_20);
  puVar2 = std::end<unsigned_short,8ul>((unsigned_short (*) [8])local_20);
  dVar3 = std::
          count_if<unsigned_short*,wabt::interp::Thread::DoSimdIsTrue<wabt::interp::Simd<unsigned_short,(unsigned_char)8>,(unsigned_char)1>()::_lambda(unsigned_short)_1_>
                    (puVar1,puVar2);
  Push<bool>(this,0 < dVar3);
  return Ok;
}

Assistant:

RunResult Thread::DoSimdIsTrue() {
  using L = typename S::LaneType;
  auto val = Pop<S>();
  Push(std::count_if(std::begin(val.v), std::end(val.v),
                     [](L x) { return x != 0; }) >= count);
  return RunResult::Ok;
}